

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

QJsonObject * __thiscall EnumDef::toJson(EnumDef *this,ClassDef *cdef)

{
  bool bVar1;
  Int IVar2;
  QByteArray *key;
  QList<QByteArray> *this_00;
  ulong uVar3;
  long in_RDX;
  long in_RSI;
  QJsonObject *in_RDI;
  long in_FS_OFFSET;
  QByteArray *value;
  QList<QByteArray> *__range1;
  uint flags;
  QJsonObject *def;
  const_iterator __end1;
  const_iterator __begin1;
  QJsonArray valueArr;
  QJsonObject *this_01;
  undefined1 local_198 [16];
  undefined1 local_188 [24];
  QByteArray *local_170;
  const_iterator local_168;
  const_iterator local_160;
  undefined1 *local_158;
  QJsonValueRef local_150 [16];
  QJsonValueRef local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [24];
  undefined1 local_108 [16];
  undefined1 local_f8 [24];
  QJsonValueRef local_e0 [16];
  undefined1 local_d0 [24];
  undefined1 local_b8 [4];
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_b4;
  QJsonValue local_b0 [24];
  QJsonValue local_98 [24];
  QJsonValue local_80 [24];
  QJsonValue local_68 [24];
  QJsonValue local_50 [24];
  QJsonValue local_38 [24];
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QJsonObject::QJsonObject(in_RDI);
  key = (QByteArray *)(in_RSI + 0x60);
  this_00 = (QList<QByteArray> *)(in_RDX + 0x48);
  memset(local_b8,0,4);
  QFlags<QtMocConstants::EnumFlags>::QFlags((QFlags<QtMocConstants::EnumFlags> *)0x13ba14);
  QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::value
            ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)this_01,key,
             (QFlags<QtMocConstants::EnumFlags> *)this_00);
  local_b4.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
       (QFlagsStorage<QtMocConstants::EnumFlags>)
       QFlags<QtMocConstants::EnumFlags>::operator|
                 ((QFlags<QtMocConstants::EnumFlags> *)this_00,
                  (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)SUB84(key,0));
  IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_b4);
  QString::fromUtf8<void>((QByteArray *)this_00);
  QJsonValue::QJsonValue(local_20,(QString *)local_d0);
  Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
  local_e0 = (QJsonValueRef  [16])QJsonObject::operator[]((QLatin1String *)this_01);
  QJsonValueRef::operator=(local_e0,local_20);
  QJsonValue::~QJsonValue(local_20);
  QString::~QString((QString *)0x13baff);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x13bb0d);
  if (!bVar1) {
    QString::fromUtf8<void>((QByteArray *)this_00);
    QJsonValue::QJsonValue(local_38,(QString *)local_f8);
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    local_108 = QJsonObject::operator[]((QLatin1String *)this_01);
    QJsonValueRef::operator=((QJsonValueRef *)local_108,local_38);
    QJsonValue::~QJsonValue(local_38);
    QString::~QString((QString *)0x13bbb4);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x13bbc2);
  if (!bVar1) {
    QString::fromUtf8<void>((QByteArray *)this_00);
    QJsonValue::QJsonValue(local_50,(QString *)local_120);
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    local_130 = QJsonObject::operator[]((QLatin1String *)this_01);
    QJsonValueRef::operator=((QJsonValueRef *)local_130,local_50);
    QJsonValue::~QJsonValue(local_50);
    QString::~QString((QString *)0x13bc63);
  }
  QJsonValue::QJsonValue(local_68,(IVar2 & 1) != 0);
  Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
  local_140 = (QJsonValueRef  [16])QJsonObject::operator[]((QLatin1String *)this_01);
  QJsonValueRef::operator=(local_140,local_68);
  QJsonValue::~QJsonValue(local_68);
  QJsonValue::QJsonValue(local_80,(IVar2 & 2) != 0);
  Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
  local_150 = (QJsonValueRef  [16])QJsonObject::operator[]((QLatin1String *)this_01);
  QJsonValueRef::operator=(local_150,local_80);
  QJsonValue::~QJsonValue(local_80);
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_158);
  local_160.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_160 = QList<QByteArray>::begin(this_00);
  local_168.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_168 = QList<QByteArray>::end(this_00);
  while( true ) {
    local_170 = local_168.i;
    bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_160,local_168);
    if (!bVar1) break;
    QList<QByteArray>::const_iterator::operator*(&local_160);
    QString::fromUtf8<void>((QByteArray *)this_00);
    QJsonValue::QJsonValue(local_98,(QString *)local_188);
    QJsonArray::append((QJsonValue *)&local_158);
    QJsonValue::~QJsonValue(local_98);
    QString::~QString((QString *)0x13be8b);
    QList<QByteArray>::const_iterator::operator++(&local_160);
  }
  uVar3 = QJsonArray::isEmpty();
  if ((uVar3 & 1) == 0) {
    QJsonValue::QJsonValue(local_b0,(QJsonArray *)&local_158);
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    local_198 = QJsonObject::operator[]((QLatin1String *)this_01);
    QJsonValueRef::operator=((QJsonValueRef *)local_198,local_b0);
    QJsonValue::~QJsonValue(local_b0);
  }
  QJsonArray::~QJsonArray((QJsonArray *)&local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QJsonObject EnumDef::toJson(const ClassDef &cdef) const
{
    QJsonObject def;
    uint flags = this->flags | cdef.enumDeclarations.value(name);
    def["name"_L1] = QString::fromUtf8(name);
    if (!enumName.isEmpty())
        def["alias"_L1] = QString::fromUtf8(enumName);
    if (!type.isEmpty())
        def["type"_L1] = QString::fromUtf8(type);
    def["isFlag"_L1] = (flags & EnumIsFlag) != 0;
    def["isClass"_L1] = (flags & EnumIsScoped) != 0;

    QJsonArray valueArr;
    for (const QByteArray &value: values)
        valueArr.append(QString::fromUtf8(value));
    if (!valueArr.isEmpty())
        def["values"_L1] = valueArr;

    return def;
}